

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::OnCallSpec<bool_(unsigned_short)>::Matches
          (OnCallSpec<bool_(unsigned_short)> *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  OnCallSpec<bool_(unsigned_short)> *this_local;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<unsigned_short>>,std::tuple<unsigned_short>>
                    ((tuple<testing::Matcher<unsigned_short>_> *)(this + 0x10),args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<unsigned_short>_&>::Matches
                         ((MatcherBase<const_std::tuple<unsigned_short>_&> *)(this + 0x28),args);
  }
  return local_19;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }